

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c7d376::cmLBDepend::AddDependency
          (cmLBDepend *this,cmDependInformation *info,string *file)

{
  cmDependInformation *info_00;
  cmDependInformation *dependInfo;
  string *file_local;
  cmDependInformation *info_local;
  cmLBDepend *this_local;
  
  info_00 = GetDependInformation(this,file,&info->PathOnly);
  GenerateDependInformation(this,info_00);
  cmDependInformation::AddDependencies(info,info_00);
  return;
}

Assistant:

void AddDependency(cmDependInformation* info, const std::string& file)
  {
    cmDependInformation* dependInfo =
      this->GetDependInformation(file, info->PathOnly);
    this->GenerateDependInformation(dependInfo);
    info->AddDependencies(dependInfo);
  }